

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  int64_t iVar5;
  void *pvVar6;
  int64_t iVar7;
  void *pvVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  size_t min;
  
  wVar11 = L'\xffffffff';
  if (best_bid < L'!') {
    pvVar3 = a->format->data;
    wVar11 = L'\0';
    sVar4 = __archive_read_seek(a,0,2);
    if (0 < (long)sVar4) {
      min = 0x4000;
      if ((long)sVar4 < 0x4000) {
        min = sVar4;
      }
      iVar13 = (int)min;
      iVar5 = __archive_read_seek(a,(long)-iVar13,2);
      if (-1 < iVar5) {
        wVar12 = L'\0';
        wVar11 = L'\0';
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (0x16 < iVar13 && pvVar6 != (void *)0x0) {
          uVar14 = iVar13 - 0x16;
          do {
            uVar15 = (ulong)uVar14;
            bVar1 = *(byte *)((long)pvVar6 + uVar15);
            if (bVar1 < 0x4b) {
              if (bVar1 == 5) {
                iVar13 = -2;
              }
              else if (bVar1 == 6) {
                iVar13 = -3;
              }
              else {
LAB_00472536:
                iVar13 = -4;
              }
            }
            else if (bVar1 == 0x4b) {
              iVar13 = -1;
            }
            else {
              if (bVar1 != 0x50) goto LAB_00472536;
              iVar13 = -4;
              if (*(int *)((long)pvVar6 + uVar15) == 0x6054b50) {
                wVar11 = L'\0';
                bVar16 = true;
                if ((((*(short *)((long)pvVar6 + uVar15 + 4) == 0) &&
                     (*(short *)((long)pvVar6 + uVar15 + 6) == 0)) &&
                    (*(short *)((long)pvVar6 + uVar15 + 10) == *(short *)((long)pvVar6 + uVar15 + 8)
                    )) && (uVar2 = *(uint *)((long)pvVar6 + uVar15 + 0x10), wVar11 = L'\0',
                          (long)(ulong)(*(int *)((long)pvVar6 + uVar15 + 0xc) + uVar2) <=
                          (long)(iVar5 + uVar15))) {
                  *(ulong *)((long)pvVar3 + 0x18) = (ulong)uVar2;
                  wVar11 = L' ';
                  bVar16 = false;
                }
                if (((((!bVar16) && (wVar12 = wVar11, 0x13 < (int)uVar14)) &&
                     ((*(int *)((long)pvVar6 + (uVar15 - 0x14)) == 0x7064b50 &&
                      ((*(int *)((long)pvVar6 + (uVar15 - 0x10)) == 0 &&
                       (*(int *)((long)pvVar6 + (uVar15 - 4)) == 1)))))) &&
                    (iVar7 = __archive_read_seek(a,*(int64_t *)((long)pvVar6 + (uVar15 - 0xc)),0),
                    -1 < iVar7)) &&
                   ((((pvVar8 = __archive_read_ahead(a,0x38,(ssize_t *)0x0), pvVar8 != (void *)0x0
                      && (0xffffffffffffc036 < *(long *)((long)pvVar8 + 4) - 0x3ff5U)) &&
                     (pvVar8 = __archive_read_ahead
                                         (a,*(long *)((long)pvVar8 + 4) + 0xc,(ssize_t *)0x0),
                     pvVar8 != (void *)0x0)) &&
                    ((*(int *)((long)pvVar8 + 0x10) == 0 && (*(int *)((long)pvVar8 + 0x14) == 0)))))
                   ) {
                  uVar9 = archive_le64dec((void *)((long)pvVar8 + 0x18));
                  uVar10 = archive_le64dec((void *)((long)pvVar8 + 0x20));
                  if (uVar9 == uVar10) {
                    uVar9 = archive_le64dec((void *)((long)pvVar8 + 0x30));
                    *(uint64_t *)((long)pvVar3 + 0x18) = uVar9;
                  }
                }
                if (!bVar16) {
                  return wVar12;
                }
              }
            }
            bVar16 = SCARRY4(uVar14,iVar13);
            uVar14 = uVar14 + iVar13;
          } while (uVar14 != 0 && bVar16 == (int)uVar14 < 0);
          wVar11 = L'\0';
        }
      }
    }
  }
  return wVar11;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				if (ret > 0) {
					/* Zip64 EOCD locator precedes
					 * regular EOCD if present. */
					if (i >= 20
					    && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
						read_zip64_eocd(a, zip, p + i - 20);
					}
					return (ret);
				}
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}